

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationXX.hpp
# Opt level: O1

RotationXX<std::complex<double>_> *
qclab::qgates::operator*
          (RotationXX<std::complex<double>_> *__return_storage_ptr__,
          RotationXX<std::complex<double>_> *lhs,RotationXX<std::complex<double>_> *rhs)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  
  iVar7 = (lhs->super_QRotationGate2<std::complex<double>_>).qubits_._M_elems[0];
  iVar6 = (*(rhs->super_QRotationGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
            super_QObject<std::complex<double>_>._vptr_QObject[3])(rhs);
  if (iVar7 != iVar6) {
    __assert_fail("lhs.qubit() == rhs.qubit()",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/RotationXX.hpp"
                  ,0xca,
                  "RotationXX<T> qclab::qgates::operator*(RotationXX<T>, const RotationXX<T> &)");
  }
  iVar7 = (*(lhs->super_QRotationGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
            super_QObject<std::complex<double>_>._vptr_QObject[3])(lhs);
  iVar6 = (*(rhs->super_QRotationGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
            super_QObject<std::complex<double>_>._vptr_QObject[3])(rhs);
  if (iVar7 == iVar6) {
    dVar1 = (lhs->super_QRotationGate2<std::complex<double>_>).rotation_.angle_.cos_;
    dVar2 = (lhs->super_QRotationGate2<std::complex<double>_>).rotation_.angle_.sin_;
    dVar3 = (rhs->super_QRotationGate2<std::complex<double>_>).rotation_.angle_.cos_;
    dVar4 = (rhs->super_QRotationGate2<std::complex<double>_>).rotation_.angle_.sin_;
    (lhs->super_QRotationGate2<std::complex<double>_>).rotation_.angle_.cos_ =
         dVar1 * dVar3 - dVar4 * dVar2;
    (lhs->super_QRotationGate2<std::complex<double>_>).rotation_.angle_.sin_ =
         dVar2 * dVar3 + dVar4 * dVar1;
    (__return_storage_ptr__->super_QRotationGate2<std::complex<double>_>).
    super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject =
         (_func_int **)&PTR_nbQubits_00523f70;
    (__return_storage_ptr__->super_QRotationGate2<std::complex<double>_>).super_QAdjustable.fixed_ =
         (lhs->super_QRotationGate2<std::complex<double>_>).super_QAdjustable.fixed_;
    (__return_storage_ptr__->super_QRotationGate2<std::complex<double>_>).
    super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject =
         (_func_int **)&PTR_nbQubits_00523ee8;
    uVar5 = *(undefined8 *)&(lhs->super_QRotationGate2<std::complex<double>_>).field_0x14;
    dVar1 = (lhs->super_QRotationGate2<std::complex<double>_>).rotation_.angle_.cos_;
    dVar2 = (lhs->super_QRotationGate2<std::complex<double>_>).rotation_.angle_.sin_;
    *(undefined8 *)
     (__return_storage_ptr__->super_QRotationGate2<std::complex<double>_>).qubits_._M_elems =
         *(undefined8 *)(lhs->super_QRotationGate2<std::complex<double>_>).qubits_._M_elems;
    *(undefined8 *)&(__return_storage_ptr__->super_QRotationGate2<std::complex<double>_>).field_0x14
         = uVar5;
    (__return_storage_ptr__->super_QRotationGate2<std::complex<double>_>).rotation_.angle_.cos_ =
         dVar1;
    (__return_storage_ptr__->super_QRotationGate2<std::complex<double>_>).rotation_.angle_.sin_ =
         dVar2;
    (__return_storage_ptr__->super_QRotationGate2<std::complex<double>_>).
    super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject =
         (_func_int **)&PTR_nbQubits_00523e10;
    return __return_storage_ptr__;
  }
  __assert_fail("this->qubit() == rhs.qubit()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/RotationXX.hpp"
                ,0xbb,
                "RotationXX<T> &qclab::qgates::RotationXX<std::complex<double>>::operator*=(const RotationXX<T> &) [T = std::complex<double>]"
               );
}

Assistant:

RotationXX< T > operator*( RotationXX< T > lhs ,
                                         const RotationXX< T >& rhs ) {
          assert( lhs.qubit() == rhs.qubit() ) ;
          lhs *= rhs ;
          return lhs ;
        }